

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

bool __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::load_data(section_impl<ELFIO::Elf32_Shdr> *this)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  const_iterator __begin2;
  pointer paVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar6;
  
  uVar1 = (this->header).sh_offset;
  uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (this->convertor->need_conversion == false) {
    uVar3 = uVar1;
  }
  uVar9 = (ulong)uVar3;
  for (paVar5 = (this->translator->addr_translations).
                super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar5 != (this->translator->addr_translations).
                super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                ._M_impl.super__Vector_impl_data._M_finish; paVar5 = paVar5 + 0x30) {
    lVar8 = uVar9 - *(long *)paVar5;
    if ((*(long *)paVar5 <= (long)uVar9) && (lVar8 < *(long *)(paVar5 + 0x10))) {
      uVar9 = lVar8 + *(long *)(paVar5 + 0x20);
      break;
    }
  }
  iVar4 = (*(this->super_section)._vptr_section[0x13])(this);
  uVar6 = CONCAT44(extraout_var,iVar4);
  iVar4 = (*(this->super_section)._vptr_section[0x20])(this);
  if (((uVar9 <= CONCAT44(extraout_var_00,iVar4)) &&
      (iVar4 = (*(this->super_section)._vptr_section[0x20])(this),
      uVar6 <= CONCAT44(extraout_var_01,iVar4))) &&
     (iVar4 = (*(this->super_section)._vptr_section[0x20])(this),
     uVar6 <= CONCAT44(extraout_var_02,iVar4) - uVar9)) {
    if ((((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) ||
        (iVar4 = (*(this->super_section)._vptr_section[5])(this), iVar4 == 0)) ||
       (iVar4 = (*(this->super_section)._vptr_section[5])(this), iVar4 == 8)) {
      bVar10 = true;
      if (((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) &&
         (iVar4 = (*(this->super_section)._vptr_section[5])(this), iVar4 != 0)) {
        iVar4 = (*(this->super_section)._vptr_section[5])(this);
        bVar10 = iVar4 == 8;
      }
      this->is_loaded = bVar10;
      return bVar10;
    }
    if (uVar6 != 0xffffffffffffffff) {
      pcVar7 = (char *)operator_new__(uVar6 + 1,(nothrow_t *)&std::nothrow);
      pcVar2 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar7;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      if (uVar6 == 0) {
        this->data_size = 0;
LAB_00106306:
        this->is_loaded = true;
        return true;
      }
      if ((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) {
        std::istream::seekg(this->pstream,uVar9,0);
        std::istream::read((char *)this->pstream,
                           (long)(this->data)._M_t.
                                 super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                 super__Head_base<0UL,_char_*,_false>._M_head_impl);
        if (*(ulong *)(this->pstream + 8) == uVar6) {
          this->data_size = uVar6;
          (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar6] = '\0';
          goto LAB_00106306;
        }
        pcVar2 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
      }
      this->data_size = 0;
    }
  }
  return false;
}

Assistant:

bool load_data() const
    {
        Elf_Xword sh_offset = (*translator)[(*convertor)(header.sh_offset)];
        Elf_Xword size = get_size();
        
        // Check for integer overflow in offset calculation
        if (sh_offset > get_stream_size()) {
            return false;
        }
        
        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - sh_offset)) {
            return false;
        }

        // Check if we need to load data
        if (nullptr == data && SHT_NULL != get_type() && SHT_NOBITS != get_type()) {
            // Check if size can be safely converted to size_t
            if (size > std::numeric_limits<size_t>::max() - 1) {
                return false;
            }
            
            data.reset(new (std::nothrow) char[size_t(size) + 1]);

            if ((0 != size) && (nullptr != data)) {
                pstream->seekg(sh_offset);
                pstream->read(data.get(), size);
                if (static_cast<Elf_Xword>(pstream->gcount()) != size) {
                    data.reset(nullptr);
                    data_size = 0;
                    return false;
                }

                data_size = size;
                data.get()[size] = 0; // Safe now as we allocated size + 1
            }
            else {
                data_size = 0;
                if (size != 0) {
                    return false; // Failed to allocate required memory
                }
            }
            
            is_loaded = true;
            return true;
        }

        // Data already loaded or doesn't need loading
        is_loaded = (nullptr != data) || (SHT_NULL == get_type()) || (SHT_NOBITS == get_type());
        return is_loaded;
    }